

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBar::setCurrentIndex(QTabBar *this,int index)

{
  uint index_00;
  QTabBarPrivate *this_00;
  Tab *pTVar1;
  char cVar2;
  bool bVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  int local_5c;
  code *local_58;
  int *local_50;
  QTabBar *pQStack_48;
  int local_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((this_00->field_0x2d1 & 2) == 0) || (this_00->pressedIndex == -1)) {
    index_00 = this_00->currentIndex;
    if ((index_00 != index) &&
       (((ulong)(long)index < (ulong)(this_00->tabList).d.size &&
        (pTVar1 = (this_00->tabList).d.ptr[index], pTVar1 != (Tab *)0x0)))) {
      this_00->currentIndex = index;
      QVar5 = tabRect(this,index);
      uVar4 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,index);
      if (((QVar5.x2.m_i.m_i - QVar5.x1.m_i) + 1 != (int)uVar4) ||
         ((QVar5.y2.m_i.m_i - QVar5.y1.m_i) + 1 != (int)((ulong)uVar4 >> 0x20))) {
        QTabBarPrivate::layoutTabs(this_00);
      }
      QWidget::update(&this->super_QWidget);
      if ((((this->super_QWidget).data)->widget_attributes & 0x8000) == 0) {
        this_00->field_0x2d0 = this_00->field_0x2d0 | 1;
      }
      else {
        QTabBarPrivate::makeVisible(this_00,index);
      }
      if ((-1 < (int)index_00) && ((ulong)index_00 < (ulong)(this_00->tabList).d.size)) {
        pTVar1->lastTab = index_00;
        QTabBarPrivate::layoutTab(this_00,index_00);
      }
      QTabBarPrivate::layoutTab(this_00,index);
      cVar2 = QAccessible::isActive();
      if (cVar2 != '\0') {
        bVar3 = QWidget::hasFocus(&this->super_QWidget);
        if (bVar3) {
          local_58 = QFont::strikeOut;
          local_50 = (int *)0xaaaaaaaa00008005;
          _local_40 = CONCAT44(0xaaaaaaaa,index);
          pQStack_48 = this;
          QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
          QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
        }
        local_58 = QFont::strikeOut;
        local_50 = (int *)0xaaaaaaaa00008006;
        _local_40 = CONCAT44(0xaaaaaaaa,index);
        pQStack_48 = this;
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
        QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
      }
      local_50 = &local_5c;
      local_58 = (code *)0x0;
      local_5c = index;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::setCurrentIndex(int index)
{
    Q_D(QTabBar);
    if (d->dragInProgress && d->pressedIndex != -1)
        return;
    if (d->currentIndex == index)
        return;

    int oldIndex = d->currentIndex;
    if (auto tab = d->at(index)) {
        d->currentIndex = index;
        // If the size hint depends on whether the tab is selected (for instance a style
        // sheet rule that sets a bold font on the 'selected' tab) then we need to
        // re-layout the entire tab bar. To minimize the cost, do that only if the
        // size hint changes for the tab that becomes the current tab (the old current tab
        // will most certainly do the same). QTBUG-6905
        if (tabRect(index).size() != tabSizeHint(index))
            d->layoutTabs();
        update();
        if (!isVisible())
            d->layoutDirty = true;
        else
            d->makeVisible(index);
        if (d->validIndex(oldIndex)) {
            tab->lastTab = oldIndex;
            d->layoutTab(oldIndex);
        }
        d->layoutTab(index);
#if QT_CONFIG(accessibility)
        if (QAccessible::isActive()) {
            if (hasFocus()) {
                QAccessibleEvent focusEvent(this, QAccessible::Focus);
                focusEvent.setChild(index);
                QAccessible::updateAccessibility(&focusEvent);
            }
            QAccessibleEvent selectionEvent(this, QAccessible::Selection);
            selectionEvent.setChild(index);
            QAccessible::updateAccessibility(&selectionEvent);
        }
#endif
        emit currentChanged(index);
    }
}